

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall
cmCTestMultiProcessHandler::LockResources(cmCTestMultiProcessHandler *this,int index)

{
  _Base_ptr __args;
  PropertiesMap *this_00;
  mapped_type pcVar1;
  const_iterator __position;
  mapped_type *ppcVar2;
  ulong uVar3;
  size_t sVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> affinity;
  int local_4c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,index);
  this_00 = &this->Properties;
  local_4c = index;
  ppcVar2 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&this_00->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,(key_type *)&local_48);
  uVar3 = (this->ParallelLevel).super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload._M_value;
  if (uVar3 == 0) {
    uVar3 = 0x10000;
  }
  if (((this->ParallelLevel).super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged == false) &&
     (uVar3 = 0x10000,
     (this->JobServerClient).super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
     super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
     super__Optional_payload_base<cmUVJobServerClient>._M_engaged == false)) {
    uVar3 = this->ParallelLevelDefault;
  }
  sVar4 = (long)(*ppcVar2)->Processors;
  if (uVar3 < (ulong)(long)(*ppcVar2)->Processors) {
    sVar4 = uVar3;
  }
  if (((this->HaveAffinity != 0) && (this->HaveAffinity < sVar4)) &&
     (ppcVar2 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&this_00->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,(key_type *)&local_48), (*ppcVar2)->WantAffinity != false)) {
    sVar4 = this->HaveAffinity;
  }
  this->RunningCount = this->RunningCount + sVar4;
  ppcVar2 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&this_00->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_4c);
  pcVar1 = *ppcVar2;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->ProjectResourcesLocked,
             (pcVar1->ProjectResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )&(pcVar1->ProjectResources)._M_t._M_impl.super__Rb_tree_header);
  if (pcVar1->RunSerial == true) {
    this->SerialTestRunning = true;
  }
  if ((this->HaveAffinity != 0) && (pcVar1->WantAffinity == true)) {
    local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_48.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,local_4c);
    ppcVar2 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&this_00->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,(key_type *)&local_48);
    uVar3 = (this->ParallelLevel).super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload._M_value;
    if (uVar3 == 0) {
      uVar3 = 0x10000;
    }
    if (((this->ParallelLevel).super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged == false) &&
       (uVar3 = 0x10000,
       (this->JobServerClient).super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
       super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
       super__Optional_payload_base<cmUVJobServerClient>._M_engaged == false)) {
      uVar3 = this->ParallelLevelDefault;
    }
    sVar4 = (long)(*ppcVar2)->Processors;
    if (uVar3 < (ulong)(long)(*ppcVar2)->Processors) {
      sVar4 = uVar3;
    }
    if (((this->HaveAffinity != 0) && (this->HaveAffinity < sVar4)) &&
       (ppcVar2 = std::
                  map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  ::operator[](&this_00->
                                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               ,(key_type *)&local_48), (*ppcVar2)->WantAffinity != false)) {
      sVar4 = this->HaveAffinity;
    }
    if ((this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_node_count < sVar4) {
      __assert_fail("needProcessors <= this->ProcessorsAvailable.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                    ,0x1cd,"void cmCTestMultiProcessHandler::LockResources(int)");
    }
    local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_48,sVar4);
    if (sVar4 != 0) {
      do {
        __position._M_node =
             (this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        __args = __position._M_node + 1;
        if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_48,
                     (iterator)
                     local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)__args);
        }
        else {
          *local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = *(unsigned_long *)__args;
          local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                            *)&this->ProcessorsAvailable,__position);
        sVar4 = sVar4 - 1;
      } while (sVar4 != 0);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&pcVar1->Affinity,&local_48);
    if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::LockResources(int index)
{
  this->RunningCount += this->GetProcessorsUsed(index);

  auto* properties = this->Properties[index];

  this->ProjectResourcesLocked.insert(properties->ProjectResources.begin(),
                                      properties->ProjectResources.end());

  if (properties->RunSerial) {
    this->SerialTestRunning = true;
  }

  if (this->HaveAffinity && properties->WantAffinity) {
    size_t needProcessors = this->GetProcessorsUsed(index);
    assert(needProcessors <= this->ProcessorsAvailable.size());
    std::vector<size_t> affinity;
    affinity.reserve(needProcessors);
    for (size_t i = 0; i < needProcessors; ++i) {
      auto p = this->ProcessorsAvailable.begin();
      affinity.push_back(*p);
      this->ProcessorsAvailable.erase(p);
    }
    properties->Affinity = std::move(affinity);
  }
}